

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

string * __thiscall
deqp::egl::(anonymous_namespace)::createTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int threads,
          int perThreadContextCount)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream local_190 [8];
  ostringstream stream;
  int perThreadContextCount_local;
  int threads_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = (ostream *)std::ostream::operator<<(local_190,(int)this);
  pcVar2 = "_threads_";
  if ((int)this == 1) {
    pcVar2 = "_thread_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,threads);
  pcVar2 = "_contexts";
  if (threads == 1) {
    pcVar2 = "_context";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

string createTestName(int threads, int perThreadContextCount)
{
	std::ostringstream stream;

	stream << threads << (threads == 1 ? "_thread_" : "_threads_") << perThreadContextCount << (perThreadContextCount == 1 ? "_context" : "_contexts");

	return stream.str();
}